

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void addPaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  uchar bit_00;
  ulong in_RCX;
  long in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  int in_R8D;
  uchar bit;
  size_t x;
  size_t ibp;
  size_t obp;
  size_t diff;
  uint y;
  ulong local_48;
  size_t local_40 [3];
  int local_28;
  int local_24;
  ulong local_20;
  uchar *local_10;
  uchar *local_8;
  
  local_40[2] = in_RDX - in_RCX;
  local_40[1] = 0;
  local_40[0] = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 != local_24; local_28 = local_28 + 1) {
    for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
      bit_00 = readBitFromReversedStream(local_40,local_10);
      setBitOfReversedStream(local_40 + 1,local_8,bit_00);
    }
    for (local_48 = 0; local_48 != local_40[2]; local_48 = local_48 + 1) {
      setBitOfReversedStream(local_40 + 1,local_8,'\0');
    }
  }
  return;
}

Assistant:

static void addPaddingBits(unsigned char* out, const unsigned char* in,
                           size_t olinebits, size_t ilinebits, unsigned h) {
  /*The opposite of the removePaddingBits function
  olinebits must be >= ilinebits*/
  unsigned y;
  size_t diff = olinebits - ilinebits;
  size_t obp = 0, ibp = 0; /*bit pointers*/
  for(y = 0; y != h; ++y) {
    size_t x;
    for(x = 0; x < ilinebits; ++x) {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    /*obp += diff; --> no, fill in some value in the padding bits too, to avoid
    "Use of uninitialised value of size ###" warning from valgrind*/
    for(x = 0; x != diff; ++x) setBitOfReversedStream(&obp, out, 0);
  }
}